

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_swrenderer.cpp
# Opt level: O1

void __thiscall
FSoftwareRenderer::RenderTextureView
          (FSoftwareRenderer *this,FCanvasTexture *tex,AActor *viewpoint,int fov)

{
  DSimpleCanvas *canvas;
  BYTE *src;
  undefined8 uVar1;
  undefined8 uVar2;
  DAngle DVar3;
  int iVar4;
  undefined4 extraout_var;
  uint y;
  uint x;
  DAngle local_40;
  DAngle local_38;
  BYTE *block;
  
  iVar4 = (*(tex->super_FTexture)._vptr_FTexture[3])(tex);
  DVar3 = FieldOfView;
  uVar2 = swrenderer::realfixedcolormap;
  uVar1 = swrenderer::fixedcolormap;
  block = (BYTE *)CONCAT44(extraout_var,iVar4);
  canvas = tex->Canvas;
  local_38.Degrees = (double)fov;
  R_SetFOV(&local_38);
  swrenderer::R_RenderViewToCanvas
            (viewpoint,&canvas->super_DCanvas,0,0,(uint)(tex->super_FTexture).Width,
             (uint)(tex->super_FTexture).Height,tex->bFirstUpdate);
  local_40.Degrees = DVar3.Degrees;
  R_SetFOV(&local_40);
  src = (canvas->super_DCanvas).Buffer;
  x = (uint)(tex->super_FTexture).Width;
  y = (uint)(tex->super_FTexture).Height;
  if (block == src) {
    FTexture::FlipSquareBlockRemap(block,x,y,GPalette.Remap);
  }
  else {
    FTexture::FlipNonSquareBlockRemap(block,src,x,y,(canvas->super_DCanvas).Pitch,GPalette.Remap);
  }
  tex->bNeedsUpdate = false;
  tex->bDidUpdate = true;
  tex->bFirstUpdate = false;
  swrenderer::fixedcolormap = uVar1;
  swrenderer::realfixedcolormap = uVar2;
  return;
}

Assistant:

void FSoftwareRenderer::RenderTextureView (FCanvasTexture *tex, AActor *viewpoint, int fov)
{
	BYTE *Pixels = const_cast<BYTE*>(tex->GetPixels());
	DSimpleCanvas *Canvas = tex->GetCanvas();

	// curse Doom's overuse of global variables in the renderer.
	// These get clobbered by rendering to a camera texture but they need to be preserved so the final rendering can be done with the correct palette.
	unsigned char *savecolormap = fixedcolormap;
	FSpecialColormap *savecm = realfixedcolormap;

	DAngle savedfov = FieldOfView;
	R_SetFOV ((double)fov);
	R_RenderViewToCanvas (viewpoint, Canvas, 0, 0, tex->GetWidth(), tex->GetHeight(), tex->bFirstUpdate);
	R_SetFOV (savedfov);
	if (Pixels == Canvas->GetBuffer())
	{
		FTexture::FlipSquareBlockRemap (Pixels, tex->GetWidth(), tex->GetHeight(), GPalette.Remap);
	}
	else
	{
		FTexture::FlipNonSquareBlockRemap (Pixels, Canvas->GetBuffer(), tex->GetWidth(), tex->GetHeight(), Canvas->GetPitch(), GPalette.Remap);
	}
	tex->SetUpdated();
	fixedcolormap = savecolormap;
	realfixedcolormap = savecm;
}